

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mustache.cpp
# Opt level: O2

QString * __thiscall
Mustache::Renderer::render
          (QString *__return_storage_ptr__,Renderer *this,QString *_template,Context *context)

{
  QString::clear(&this->m_error);
  this->m_errorPos = -1;
  QString::clear(&this->m_errorPartial);
  QString::operator=(&this->m_tagStartMarker,(QString *)&this->m_defaultTagStartMarker);
  QString::operator=(&this->m_tagEndMarker,(QString *)&this->m_defaultTagEndMarker);
  render(__return_storage_ptr__,this,_template,0,(int)(_template->d).size,context);
  return __return_storage_ptr__;
}

Assistant:

QString Renderer::render(const QString& _template, Context* context)
{
	m_error.clear();
	m_errorPos = -1;
	m_errorPartial.clear();

	m_tagStartMarker = m_defaultTagStartMarker;
	m_tagEndMarker = m_defaultTagEndMarker;

	return render(_template, 0, _template.length(), context);
}